

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_action.cpp
# Opt level: O1

bool __thiscall
cppnet::EpollEventActions::AddEvent
          (EpollEventActions *this,epoll_event *ev,int32_t event_flag,uint64_t sock,bool in_actions)

{
  int iVar1;
  SingletonLogger *this_00;
  uint *puVar2;
  bool bVar3;
  
  if ((ev->events & event_flag) == 0) {
    ev->events = ev->events | event_flag | 0x80000000;
    iVar1 = epoll_ctl(this->_epoll_handler,(uint)in_actions * 2 + 1,(int)sock,(epoll_event *)ev);
    if (iVar1 == 0) {
      bVar3 = true;
    }
    else {
      this_00 = Singleton<cppnet::SingletonLogger>::Instance();
      puVar2 = (uint *)__errno_location();
      bVar3 = false;
      SingletonLogger::Error
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                 ,0x17f,"modify event to EPOLL failed! error :%d, sock: %d",(ulong)*puVar2,sock);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool EpollEventActions::AddEvent(epoll_event* ev, int32_t event_flag, uint64_t sock, bool in_actions) {
    //if not add to EPOLL
    if (!(ev->events & event_flag)) {
#ifdef __win__
        ev->events |= event_flag;
#else
        if (__epoll_use_et) {
            ev->events |= event_flag | EPOLLET;

        } else {
             ev->events |= event_flag;
        }
#if LINUX_VERSION_CODE >= KERNEL_VERSION(4,5,0)
        if (__epoll_exclusive) {
            ev->events |= EPOLLEXCLUSIVE;
        }
#endif
#endif

        int32_t ret = 0;
        if (in_actions) {
            ret = epoll_ctl(_epoll_handler, EPOLL_CTL_MOD, sock, ev);

        } else {
            ret = epoll_ctl(_epoll_handler, EPOLL_CTL_ADD, sock, ev);
        }
            
        if (ret == 0) {
            return true;
        }
        LOG_ERROR("modify event to EPOLL failed! error :%d, sock: %d", errno, sock);
    }
    return false;
}